

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::blit_framebuffer_multisample
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  deUint32 rbo [2];
  string local_68;
  deUint32 fbo [2];
  string local_40;
  
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,2,fbo);
  glu::CallLogWrapper::glGenRenderbuffers(&ctx->super_CallLogWrapper,2,rbo);
  glu::CallLogWrapper::glBindRenderbuffer(&ctx->super_CallLogWrapper,0x8d41,rbo[0]);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8ca8,fbo[0]);
  glu::CallLogWrapper::glRenderbufferStorageMultisample
            (&ctx->super_CallLogWrapper,0x8d41,4,0x8058,0x20,0x20);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&ctx->super_CallLogWrapper,0x8ca8,0x8ce0,0x8d41,rbo[0]);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8ca8);
  glu::CallLogWrapper::glBindRenderbuffer(&ctx->super_CallLogWrapper,0x8d41,rbo[1]);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8ca9,fbo[1]);
  NegativeTestContext::expectError(ctx,0);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"GL_NV_framebuffer_multisample","");
  bVar2 = NegativeTestContext::isExtensionSupported(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "GL_INVALID_OPERATION is generated if the value of GL_SAMPLE_BUFFERS for the draw buffer is greater than zero."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glRenderbufferStorageMultisample
              (&ctx->super_CallLogWrapper,0x8d41,4,0x8058,0x20,0x20);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&ctx->super_CallLogWrapper,0x8ca9,0x8ce0,0x8d41,rbo[1]);
    glu::CallLogWrapper::glBlitFramebuffer
              (&ctx->super_CallLogWrapper,0,0,0x10,0x10,0,0,0x10,0x10,0x4000,0x2600);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "GL_INVALID_OPERATION is generated if GL_SAMPLE_BUFFERS for the read buffer is greater than zero and the formats of draw and read buffers are not identical."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glRenderbufferStorage(&ctx->super_CallLogWrapper,0x8d41,0x8056,0x20,0x20);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&ctx->super_CallLogWrapper,0x8ca9,0x8ce0,0x8d41,rbo[1]);
    glu::CallLogWrapper::glBlitFramebuffer
              (&ctx->super_CallLogWrapper,0,0,0x10,0x10,0,0,0x10,0x10,0x4000,0x2600);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "GL_INVALID_OPERATION is generated if GL_SAMPLE_BUFFERS for the read buffer is greater than zero and the source and destination rectangles are not defined with the same (X0, Y0) and (X1, Y1) bounds."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glRenderbufferStorage(&ctx->super_CallLogWrapper,0x8d41,0x8058,0x20,0x20);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&ctx->super_CallLogWrapper,0x8ca9,0x8ce0,0x8d41,rbo[1]);
    glu::CallLogWrapper::glBlitFramebuffer
              (&ctx->super_CallLogWrapper,0,0,0x10,0x10,2,2,0x12,0x12,0x4000,0x2600);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
  }
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteRenderbuffers(&ctx->super_CallLogWrapper,2,rbo);
  glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,2,fbo);
  return;
}

Assistant:

void blit_framebuffer_multisample (NegativeTestContext& ctx)
{
	deUint32							fbo[2];
	deUint32							rbo[2];

	ctx.glGenFramebuffers				(2, fbo);
	ctx.glGenRenderbuffers				(2, rbo);

	ctx.glBindRenderbuffer				(GL_RENDERBUFFER, rbo[0]);
	ctx.glBindFramebuffer				(GL_READ_FRAMEBUFFER, fbo[0]);
	ctx.glRenderbufferStorageMultisample(GL_RENDERBUFFER, 4, GL_RGBA8, 32, 32);
	ctx.glFramebufferRenderbuffer		(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo[0]);
	ctx.glCheckFramebufferStatus		(GL_READ_FRAMEBUFFER);

	ctx.glBindRenderbuffer				(GL_RENDERBUFFER, rbo[1]);
	ctx.glBindFramebuffer				(GL_DRAW_FRAMEBUFFER, fbo[1]);

	ctx.expectError						(GL_NO_ERROR);

	if (!ctx.isExtensionSupported("GL_NV_framebuffer_multisample"))
	{
		ctx.beginSection("GL_INVALID_OPERATION is generated if the value of GL_SAMPLE_BUFFERS for the draw buffer is greater than zero.");
		ctx.glRenderbufferStorageMultisample(GL_RENDERBUFFER, 4, GL_RGBA8, 32, 32);
		ctx.glFramebufferRenderbuffer		(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo[1]);
		ctx.glBlitFramebuffer				(0, 0, 16, 16, 0, 0, 16, 16, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		ctx.expectError						(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if GL_SAMPLE_BUFFERS for the read buffer is greater than zero and the formats of draw and read buffers are not identical.");
		ctx.glRenderbufferStorage			(GL_RENDERBUFFER, GL_RGBA4, 32, 32);
		ctx.glFramebufferRenderbuffer		(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo[1]);
		ctx.glBlitFramebuffer				(0, 0, 16, 16, 0, 0, 16, 16, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		ctx.expectError						(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if GL_SAMPLE_BUFFERS for the read buffer is greater than zero and the source and destination rectangles are not defined with the same (X0, Y0) and (X1, Y1) bounds.");
		ctx.glRenderbufferStorage			(GL_RENDERBUFFER, GL_RGBA8, 32, 32);
		ctx.glFramebufferRenderbuffer		(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo[1]);
		ctx.glBlitFramebuffer				(0, 0, 16, 16, 2, 2, 18, 18, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		ctx.expectError						(GL_INVALID_OPERATION);
		ctx.endSection();
	}

	ctx.glBindFramebuffer				(GL_FRAMEBUFFER, 0);
	ctx.glDeleteRenderbuffers			(2, rbo);
	ctx.glDeleteFramebuffers			(2, fbo);
}